

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.h
# Opt level: O1

void __thiscall Node::~Node(Node *this)

{
  Node *pNVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pNVar1 = this->Tree[0];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[1];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[2];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[3];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Tree[4];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Block[0];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Block[1];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pNVar1 = this->Block[2];
  if (pNVar1 != (Node *)0x0) {
    ~Node(pNVar1);
    operator_delete(pNVar1,0x70);
  }
  pcVar2 = (this->TextValue)._M_dataplus._M_p;
  paVar3 = &(this->TextValue).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Node() { delete Tree[0]; delete Tree[1]; delete Tree[2];
		delete Tree[3]; delete Tree[4];
		delete Block[0]; delete Block[1]; delete Block[2]; }